

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

RESULT_TYPE_conflict3 __thiscall
duckdb::Interpolator<true>::InterpolateInternal<float,duckdb::QuantileDirect<float>>
          (Interpolator<true> *this,float *v_t,QuantileDirect<float> *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  long lVar3;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<float>_>_> __comp;
  idx_t iVar4;
  ulong uVar5;
  undefined7 uStack_17;
  
  iVar1 = this->begin;
  iVar4 = this->FRN;
  iVar2 = this->end;
  if (iVar4 != iVar2 && iVar1 != iVar2) {
    uVar5 = (long)(iVar2 * 4 + iVar1 * -4) >> 2;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    __comp._M_comp._17_7_ = uStack_17;
    __comp._M_comp.desc = this->desc;
    __comp._M_comp.accessor_r = accessor;
    __comp._M_comp.accessor_l = accessor;
    ::std::
    __introselect<float*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<float>>>>
              (v_t + iVar1,v_t + iVar4,v_t + iVar2,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp);
    iVar4 = this->FRN;
  }
  return v_t[iVar4];
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}